

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tun_linux.c
# Opt level: O0

_Bool if_up(char *ifname)

{
  int iVar1;
  char *in_RDI;
  _Bool success;
  ifreq r;
  int fd;
  char local_40 [16];
  ushort local_30;
  int local_14;
  char *local_10;
  _Bool local_1;
  
  local_10 = in_RDI;
  local_14 = socket(2,2,0);
  if (local_14 == -1) {
    local_1 = false;
  }
  else {
    memset(local_40,0,0x28);
    strncpy(local_40,local_10,0x10);
    iVar1 = ioctl(local_14,0x8913,local_40);
    if (iVar1 == -1) {
      close(local_14);
      local_1 = false;
    }
    else {
      local_30 = local_30 | 0x41;
      iVar1 = ioctl(local_14,0x8914,local_40);
      close(local_14);
      local_1 = iVar1 != -1;
    }
  }
  return local_1;
}

Assistant:

static bool if_up(const char * ifname)
{
  int fd = socket(AF_INET, SOCK_DGRAM, 0);
  if(fd == -1) return false;
  struct ifreq r;
  memset(&r, 0, sizeof(struct ifreq));
  strncpy(r.ifr_name, ifname, sizeof(r.ifr_name));
  if(ioctl(fd, SIOCGIFFLAGS, &r) == -1)
  {
    close(fd);
    return false;
  }
  r.ifr_flags |= IFF_UP | IFF_RUNNING;
  bool success = ioctl(fd, SIOCSIFFLAGS, &r) != -1;
  close(fd);
  return success;
}